

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_compatible_gxx_retrigger(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  long in_RSI;
  long in_RDI;
  byte bVar1;
  int flags;
  
  bVar1 = 0;
  if (((*(short *)(in_RSI + 0x5c) != 0) && ((*(uint *)(in_RDI + 100) & 4) != 0)) &&
     ((**(uint **)(in_RSI + 0x88) & 2) == 0)) {
    bVar1 = (*(byte *)(*(long *)(*(long *)(in_RSI + 0x88) + 0x20) + 0x30) & 8) != 0;
    if ((*(byte *)(*(long *)(*(long *)(in_RSI + 0x88) + 0x20) + 0x82) & 8) != 0) {
      bVar1 = bVar1 | 2;
    }
    if ((*(byte *)(*(long *)(*(long *)(in_RSI + 0x88) + 0x20) + 0xd4) & 8) != 0) {
      bVar1 = bVar1 | 4;
    }
  }
  if ((bVar1 & 1) == 0) {
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x74) = 0;
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x78) = 0;
  }
  if ((bVar1 & 2) == 0) {
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x80) = 0;
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x84) = 0;
  }
  if ((bVar1 & 4) == 0) {
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x8c) = 0;
    *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x90) = 0;
  }
  *(undefined4 *)(*(long *)(in_RSI + 0x88) + 0x98) = 0x400;
  **(uint **)(in_RSI + 0x88) = **(uint **)(in_RSI + 0x88) & 0xfffffff0;
  it_playing_update_resamplers(*(IT_PLAYING **)(in_RSI + 0x88));
  if (((bVar1 == 0) && (*(short *)(in_RSI + 0x5c) != 0)) && ((*(uint *)(in_RDI + 100) & 4) != 0)) {
    *(long *)(*(long *)(in_RSI + 0x88) + 0x20) =
         *(long *)(in_RDI + 0x110) + (long)(int)(*(byte *)(in_RSI + 0xe) - 1) * 0x29c;
  }
  return;
}

Assistant:

static void it_compatible_gxx_retrigger(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	int flags = 0;
	if (channel->sample) {
		if (sigdata->flags & IT_USE_INSTRUMENTS) {
			if (!(channel->playing->flags & IT_PLAYING_SUSTAINOFF)) {
				if (channel->playing->env_instrument->volume_envelope.flags & IT_ENVELOPE_CARRY)
					flags |= 1;
				if (channel->playing->env_instrument->pan_envelope.flags & IT_ENVELOPE_CARRY)
					flags |= 2;
				if (channel->playing->env_instrument->pitch_envelope.flags & IT_ENVELOPE_CARRY)
					flags |= 4;
			}
		}
	}
	if (!(flags & 1)) {
		channel->playing->volume_envelope.next_node = 0;
		channel->playing->volume_envelope.tick = 0;
	}
	if (!(flags & 2)) {
		channel->playing->pan_envelope.next_node = 0;
		channel->playing->pan_envelope.tick = 0;
	}
	if (!(flags & 4)) {
		channel->playing->pitch_envelope.next_node = 0;
		channel->playing->pitch_envelope.tick = 0;
	}
	channel->playing->fadeoutcount = 1024;
	// Should we remove IT_PLAYING_BACKGROUND? Test with sample with sustain loop...
	channel->playing->flags &= ~(IT_PLAYING_BACKGROUND | IT_PLAYING_SUSTAINOFF | IT_PLAYING_FADING | IT_PLAYING_DEAD);
	it_playing_update_resamplers(channel->playing);

	if (!flags && channel->sample)
		if (sigdata->flags & IT_USE_INSTRUMENTS)
			channel->playing->env_instrument = &sigdata->instrument[channel->instrument-1];
}